

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

QVariant * __thiscall
QTextEditControl::loadResource
          (QVariant *__return_storage_ptr__,QTextEditControl *this,int type,QUrl *name)

{
  long *plVar1;
  long in_FS_OFFSET;
  QUrl resolvedName;
  QUrl local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = (long *)QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
  if (plVar1 == (long *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::loadResource(__return_storage_ptr__,(QWidgetTextControl *)this,type,name);
      return __return_storage_ptr__;
    }
  }
  else {
    local_38.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)plVar1[1] + 0xc0))(&local_38,(long *)plVar1[1],name);
    (**(code **)(*plVar1 + 0x1c8))(__return_storage_ptr__,plVar1,type,&local_38);
    QUrl::~QUrl(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant loadResource(int type, const QUrl &name) override {
        auto *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::loadResource(type, name);

        QUrl resolvedName = ed->d_func()->resolveUrl(name);
        return ed->loadResource(type, resolvedName);
    }